

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

Interval<float> pbrt::Sqr<float>(Interval<float> i)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  Interval<float> IVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar9 [64];
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  
  auVar9._8_56_ = in_register_00001208;
  auVar9._0_8_ = i;
  auVar8 = vmovshdup_avx(auVar9._0_16_);
  fVar6 = i.low;
  fVar13 = auVar8._0_4_;
  auVar8 = vmaxss_avx(ZEXT416((uint)(fVar6 * fVar6)),ZEXT416((uint)(fVar13 * fVar13)));
  fVar10 = auVar8._0_4_;
  if ((fVar6 <= 0.0) && (0.0 <= fVar13)) {
    iVar4 = 0x7f800000;
    if (fVar10 < INFINITY) {
      auVar7._0_12_ = ZEXT812(0);
      auVar7._12_4_ = 0;
      uVar2 = vcmpss_avx512f(auVar8,auVar7,0);
      fVar10 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar10);
      iVar4 = (-(uint)(fVar10 < 0.0) | 1) + (int)fVar10;
    }
    auVar8._4_4_ = iVar4;
    auVar8._0_4_ = iVar4;
    auVar8._8_4_ = iVar4;
    auVar8._12_4_ = iVar4;
    auVar8 = vblendps_avx(auVar8,ZEXT816(0) << 0x40,0xd);
    auVar11._4_12_ = SUB1612(ZEXT816(0) << 0x40,4);
    auVar11._0_4_ = iVar4;
    uVar1 = vcmpps_avx512vl(auVar11,auVar8,1);
    IVar5.high = (float)((uint)((byte)(uVar1 >> 1) & 1) * iVar4);
    IVar5.low = (float)((uint)((byte)uVar1 & 1) * iVar4);
    return IVar5;
  }
  auVar12 = vminss_avx(ZEXT416((uint)(fVar13 * fVar13)),ZEXT416((uint)(fVar6 * fVar6)));
  uVar2 = vcmpss_avx512f(auVar12,ZEXT816(0) << 0x40,0);
  bVar3 = (bool)((byte)uVar2 & 1);
  fVar6 = (float)((uint)bVar3 * -0x80000000 + (uint)!bVar3 * auVar12._0_4_);
  auVar12 = SUB6416(ZEXT464(0x7f800000),0);
  if (fVar10 < INFINITY) {
    auVar12._0_12_ = ZEXT812(0);
    auVar12._12_4_ = 0;
    uVar2 = vcmpss_avx512f(auVar8,auVar12,0);
    fVar10 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar10);
    auVar12 = ZEXT416((-(uint)(fVar10 < 0.0) | 1) + (int)fVar10);
  }
  auVar8 = ZEXT416((int)fVar6 + -1 + (uint)(fVar6 <= 0.0) * 2);
  auVar7 = vminss_avx(auVar12,auVar8);
  auVar8 = vmaxss_avx(auVar12,auVar8);
  auVar8 = vinsertps_avx(auVar7,auVar8,0x10);
  return auVar8._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Float UpperBound() const { return high; }